

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_expr.cc
# Opt level: O0

bool __thiscall Expr::ConstFold(Expr *this,Env *env,int *pn)

{
  int iVar1;
  int *in_RDX;
  ID *in_RDI;
  int *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd8;
  bool local_1;
  
  iVar1 = *(int *)&(in_RDI->name).field_2;
  if (iVar1 == 0) {
    local_1 = Env::GetConstant((Env *)(ulong)in_stack_ffffffffffffffd8,in_RDI,
                               in_stack_ffffffffffffffc8);
  }
  else if (iVar1 == 1) {
    iVar1 = Number::Num((Number *)in_RDI[1].super_Object.filename._M_string_length);
    *in_RDX = iVar1;
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool Expr::ConstFold(Env* env, int* pn) const
	{
	switch ( expr_type_ )
		{
		case EXPR_NUM:
			*pn = num_->Num();
			return true;
		case EXPR_ID:
			return env->GetConstant(id_, pn);
		default:
			// ### FIXME: folding consts
			return false;
		}
	}